

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollisionObject.cpp
# Opt level: O1

aphy_transform * __thiscall
APhyBullet::BulletCollisionObject::getTransform(BulletCollisionObject *this)

{
  btTransform *pbVar1;
  btCollisionObject *pbVar2;
  aphy_vector3 aVar3;
  aphy_vector3 aVar4;
  aphy_vector3 aVar5;
  aphy_vector3 aVar6;
  btMatrix3x3 *pbVar7;
  aphy_transform *in_RDI;
  
  pbVar2 = this->handle;
  pbVar1 = &pbVar2->m_worldTransform;
  aVar3.pad = 0.0;
  aVar3.x = (pbVar1->m_basis).m_el[0].m_floats[0];
  aVar3.y = (pbVar1->m_basis).m_el[0].m_floats[1];
  aVar3.z = (pbVar1->m_basis).m_el[0].m_floats[2];
  (in_RDI->rotation).firstRow = aVar3;
  pbVar7 = &(pbVar2->m_worldTransform).m_basis;
  aVar4.pad = 0.0;
  aVar4.x = pbVar7->m_el[1].m_floats[0];
  aVar4.y = pbVar7->m_el[1].m_floats[1];
  aVar4.z = pbVar7->m_el[1].m_floats[2];
  (in_RDI->rotation).secondRow = aVar4;
  pbVar7 = &(pbVar2->m_worldTransform).m_basis;
  aVar5.pad = 0.0;
  aVar5.x = pbVar7->m_el[2].m_floats[0];
  aVar5.y = pbVar7->m_el[2].m_floats[1];
  aVar5.z = pbVar7->m_el[2].m_floats[2];
  (in_RDI->rotation).thirdRow = aVar5;
  aVar6.pad = 0.0;
  aVar6.x = (pbVar2->m_worldTransform).m_origin.m_floats[0];
  aVar6.y = (pbVar2->m_worldTransform).m_origin.m_floats[1];
  aVar6.z = (pbVar2->m_worldTransform).m_origin.m_floats[2];
  in_RDI->origin = aVar6;
  return in_RDI;
}

Assistant:

aphy_transform BulletCollisionObject::getTransform()
{
    return convertTransform(handle->getWorldTransform());
}